

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayout::tabifyDockWidget(QDockAreaLayout *this,QDockWidget *first,QDockWidget *second)

{
  long lVar1;
  bool bVar2;
  QDockAreaLayout *this_00;
  QLayoutItem *in_RDX;
  undefined8 in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *info;
  QList<int> path;
  QDockWidget *in_stack_ffffffffffffff78;
  QList<int> *in_stack_ffffffffffffff90;
  QWidget *in_stack_ffffffffffffffa0;
  QDockAreaLayout *this_01;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int index;
  QDockAreaLayout *this_02;
  
  index = (int)((ulong)in_RSI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  indexOf((QDockAreaLayout *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          in_stack_ffffffffffffffa0);
  bVar2 = QList<int>::isEmpty((QList<int> *)0x57b6a2);
  if (!bVar2) {
    this_00 = (QDockAreaLayout *)QDockAreaLayout::info(in_RDI,in_stack_ffffffffffffff90);
    this_01 = this_00;
    QList<int>::last((QList<int> *)in_stack_ffffffffffffff78);
    operator_new(0x18);
    QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_00,in_stack_ffffffffffffff78);
    QDockAreaLayoutInfo::tab((QDockAreaLayoutInfo *)this_02,index,in_RDX);
    QObject::objectName();
    removePlaceHolder(this_01,(QString *)in_RDI);
    QString::~QString((QString *)0x57b73a);
  }
  QList<int>::~QList((QList<int> *)0x57b74c);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayout::tabifyDockWidget(QDockWidget *first, QDockWidget *second)
{
    const QList<int> path = indexOf(first);
    if (path.isEmpty())
        return;

    QDockAreaLayoutInfo *info = this->info(path);
    Q_ASSERT(info != nullptr);
    info->tab(path.last(), new QDockWidgetItem(second));

    removePlaceHolder(second->objectName());
}